

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall cmCursesMainForm::PrintKeys(cmCursesMainForm *this,int process)

{
  FORM *form;
  bool bVar1;
  char cVar2;
  FIELD *field;
  long *plVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  char fmt_s [3];
  char firstLine [512];
  char thirdLine [512];
  char secondLine [512];
  char fmt [512];
  
  if (_stdscr == 0) {
    return;
  }
  if ((short)*(ushort *)(_stdscr + 6) < 0x40) {
    return;
  }
  iVar6 = (int)*(short *)(_stdscr + 4);
  if (*(short *)(_stdscr + 4) < 5 || (int)(*(ushort *)(_stdscr + 6) + 1) < this->InitialWidth) {
    return;
  }
  form = (this->super_cmCursesForm).Form;
  if (form == (FORM *)0x0) {
LAB_00138fd3:
    fmt_s[2] = '\0';
    fmt_s[0] = '%';
    fmt_s[1] = 's';
    bVar1 = true;
    plVar3 = (long *)0x0;
LAB_00138fd9:
    memset(firstLine,0,0x200);
    memset(secondLine,0,0x200);
    memset(thirdLine,0,0x200);
    if (process == 0) {
      if (this->OkToGenerate == true) {
        builtin_strncpy(firstLine + 0x30,"te and exit",0xc);
        builtin_strncpy(firstLine + 0x20,"ss [g] to genera",0x10);
        builtin_strncpy(firstLine + 0x18,"     Pre",8);
      }
      else {
        builtin_strncpy(firstLine + 0x30,"           ",0xc);
        builtin_strncpy(firstLine + 0x20,"                ",0x10);
        builtin_strncpy(firstLine + 0x18,"        ",8);
      }
      builtin_strncpy(firstLine,"Press [c] to configure  ",0x18);
      pcVar5 = "Off";
      if (this->AdvancedMode != false) {
        pcVar5 = "On";
      }
      sprintf(thirdLine,"Press [t] to toggle advanced mode (Currently %s)",pcVar5);
      memcpy(secondLine,"Press [h] for help           Press [q] to quit without generating",0x42);
    }
    else {
      builtin_strncpy(firstLine + 0x40,"    ",4);
      builtin_strncpy(firstLine + 0x30,"                ",0x10);
      builtin_strncpy(firstLine + 0x20,"                ",0x10);
      builtin_strncpy(firstLine + 0x10,"                ",0x10);
      builtin_strncpy(firstLine,"                ",0x10);
      builtin_strncpy(secondLine,
                      "                                                                    ",0x44);
      builtin_strncpy(thirdLine,
                      "                                                                    ",0x44);
    }
    move(iVar6 + -3,0);
    memcpy(fmt,"Press [enter] to edit option Press [d] to delete an entry",0x200);
    if (process != 0) {
      builtin_strncpy(fmt + 0x10,"           ",0xb);
      builtin_strncpy(fmt,"                ",0x10);
    }
    printw(fmt_s,fmt);
    move(iVar6 + -2,0);
    printw(fmt_s,firstLine);
    move(iVar6 + -1,0);
    printw(fmt_s,secondLine);
    move(iVar6,0);
    printw(fmt_s);
    if (bVar1) goto LAB_00139239;
  }
  else {
    field = current_field(form);
    plVar3 = (long *)field_userptr(field);
    fmt_s[2] = '\0';
    fmt_s[0] = '%';
    fmt_s[1] = 's';
    if (plVar3 == (long *)0x0) goto LAB_00138fd3;
    cVar2 = (**(code **)(*plVar3 + 0x30))(plVar3);
    if (cVar2 == '\0') {
      bVar1 = false;
      goto LAB_00138fd9;
    }
  }
  memset(firstLine,0,0x200);
  sprintf(firstLine,"Page %d of %d",(ulong)*(uint *)(plVar3 + 7),(ulong)(uint)this->NumberOfPages);
  sVar4 = strlen(firstLine);
  move(0,0x40 - (int)sVar4);
  printw(fmt_s,firstLine);
LAB_00139239:
  pos_form_cursor((this->super_cmCursesForm).Form);
  return;
}

Assistant:

void cmCursesMainForm::PrintKeys(int process /* = 0 */)
{
  int x, y;
  getmaxyx(stdscr, y, x);
  if (x < cmCursesMainForm::MIN_WIDTH || x < this->InitialWidth ||
      y < cmCursesMainForm::MIN_HEIGHT) {
    return;
  }

  // Give the current widget (if it exists), a chance to print keys
  cmCursesWidget* cw = nullptr;
  if (this->Form) {
    FIELD* currentField = current_field(this->Form);
    cw = reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));
  }

  char fmt_s[] = "%s";
  if (cw == nullptr || !cw->PrintKeys()) {
    char firstLine[512] = "";
    char secondLine[512] = "";
    char thirdLine[512] = "";
    if (process) {
      memset(firstLine, ' ', 68);
      memset(secondLine, ' ', 68);
      memset(thirdLine, ' ', 68);
    } else {
      if (this->OkToGenerate) {
        sprintf(firstLine,
                "Press [c] to configure       Press [g] to generate and exit");
      } else {
        sprintf(firstLine,
                "Press [c] to configure                                     ");
      }
      {
        const char* toggleKeyInstruction =
          "Press [t] to toggle advanced mode (Currently %s)";
        sprintf(thirdLine, toggleKeyInstruction,
                this->AdvancedMode ? "On" : "Off");
      }
      sprintf(secondLine,
              "Press [h] for help           "
              "Press [q] to quit without generating");
    }

    curses_move(y - 4, 0);
    char fmt[512] =
      "Press [enter] to edit option Press [d] to delete an entry";
    if (process) {
      memset(fmt, ' ', 27);
    }
    printw(fmt_s, fmt);
    curses_move(y - 3, 0);
    printw(fmt_s, firstLine);
    curses_move(y - 2, 0);
    printw(fmt_s, secondLine);
    curses_move(y - 1, 0);
    printw(fmt_s, thirdLine);
  }

  if (cw) {
    char pageLine[512] = "";
    sprintf(pageLine, "Page %d of %d", cw->GetPage(), this->NumberOfPages);
    curses_move(0, 65 - static_cast<unsigned int>(strlen(pageLine)) - 1);
    printw(fmt_s, pageLine);
  }

  pos_form_cursor(this->Form);
}